

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.hpp
# Opt level: O1

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
glu::
CachedValue<std::set<int,_std::less<int>,_std::allocator<int>_>,_glu::GetCompressedTextureFormats>::
getValue(CachedValue<std::set<int,_std::less<int>,_std::allocator<int>_>,_glu::GetCompressedTextureFormats>
         *this,RenderContext *context)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_40;
  
  if (this->m_isComputed == false) {
    GetCompressedTextureFormats::operator()
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_40,
               (GetCompressedTextureFormats *)context,context);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
              (&(this->m_value)._M_t);
    if (local_40._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &local_40._M_impl.super__Rb_tree_header;
      (this->m_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_40._M_impl.super__Rb_tree_header._M_header._M_color;
      (this->m_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_40._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this->m_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_40._M_impl.super__Rb_tree_header._M_header._M_left;
      (this->m_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_40._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_40._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(this->m_value)._M_t._M_impl.super__Rb_tree_header._M_header;
      (this->m_value)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_40._M_impl.super__Rb_tree_header._M_node_count;
      local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_40._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_40._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_40);
    this->m_isComputed = true;
  }
  return &this->m_value;
}

Assistant:

const T& getValue (const RenderContext& context) const
	{
		if (!m_isComputed)
		{
			m_value			= m_compute(context);
			m_isComputed	= true;
		}
		return m_value;
	}